

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdInt32x4OperationX86X64.cpp
# Opt level: O0

SIMDValue Js::SIMDInt32x4Operation::OpFromFloat64x2(SIMDValue *value)

{
  _x86_SIMDValue _Var1;
  anon_union_16_9_4d7543c8_for__SIMDValue_0 aVar2;
  double dStack_58;
  X86SIMDValue v;
  X86SIMDValue x86Result;
  SIMDValue *value_local;
  
  _Var1 = _x86_SIMDValue::ToX86SIMDValue(value);
  dStack_58 = _Var1.field_0._0_8_;
  v.field_0.i64[0] = _Var1.field_0._8_8_;
  v.field_0.i64[1] = CONCAT44((int)v.field_0.f64[0],(int)dStack_58);
  aVar2 = (anon_union_16_9_4d7543c8_for__SIMDValue_0)
          _x86_SIMDValue::ToSIMDValue((_x86_SIMDValue *)((long)&v.field_0 + 8));
  return (SIMDValue)aVar2;
}

Assistant:

SIMDValue SIMDInt32x4Operation::OpFromFloat64x2(const SIMDValue& value)
    {
        X86SIMDValue x86Result;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        // Converts the 2 double-precision, floating-point values to 32-bit signed integers
        // using truncate. using truncate one instead of _mm_cvtpd_epi32
        x86Result.m128i_value = _mm_cvttpd_epi32(v.m128d_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }